

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

void __thiscall
cppcms::impl::details::basic_map<$7159f324$>::destroy(basic_map<_7159f324_> *this,iterator p)

{
  container_alloc al;
  container *in_stack_ffffffffffffffc8;
  new_allocator<_b487a5d2_> *this_00;
  new_allocator<_b487a5d2_> local_11 [17];
  
  this_00 = local_11;
  std::allocator<$b487a5d2$>::allocator((allocator<_b487a5d2_> *)0x41814d);
  container::~container((container *)0x418157);
  __gnu_cxx::new_allocator<$b487a5d2$>::deallocate(this_00,in_stack_ffffffffffffffc8,0x41816b);
  std::allocator<$b487a5d2$>::~allocator((allocator<_b487a5d2_> *)0x418177);
  return;
}

Assistant:

void destroy(iterator p)
	{
		container_alloc al;
		p->~container();
		al.deallocate(p,1);
	}